

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

BaseType Imath_3_2::(anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix44<float>>
                   (Matrix44<float> *A)

{
  float fVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  
  fVar4 = 0.0;
  for (lVar2 = 0; lVar3 = 1, lVar2 != 4; lVar2 = lVar2 + 1) {
    for (; lVar2 + lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar1 = ABS(*(float *)((long)A + lVar3 * 4));
      if (ABS(*(float *)((long)A + lVar3 * 4)) <= fVar4) {
        fVar1 = fVar4;
      }
      fVar4 = fVar1;
    }
    A = (Matrix44<float> *)((long)A + 0x14);
  }
  return fVar4;
}

Assistant:

IMATH_CONSTEXPR14 inline typename TM::BaseType
maxOffDiagSymm (const TM& A)
{
    typedef typename TM::BaseType T;
    T                             result = 0;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = i + 1; j < TM::dimensions (); ++j)
            result = std::max (result, std::abs (A[i][j]));

    return result;
}